

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Uri.cpp
# Opt level: O2

string * __thiscall Uri::Uri::getRaw_abi_cxx11_(string *__return_storage_ptr__,Uri *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)this);
  return __return_storage_ptr__;
}

Assistant:

const string Uri::getRaw () {
    return raw;
}